

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O1

void fp::API::clearText(int x,int y)

{
  ostream *this;
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"clearText ",10);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x);
  std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
  plVar1 = (long *)std::ostream::operator<<(this,y);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void fp::API::clearText(int x, int y) {
    std::cout << "clearText " << x << " " << y << std::endl;
}